

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void swap_nifti_header(nifti_1_header *h,int is_nifti)

{
  short *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  size_t ii;
  long lVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined4 uVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  
  if (is_nifti != 0) {
    iVar11 = h->sizeof_hdr;
    auVar142 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )iVar11 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar11 >> 0x10),iVar11)) >>
                                                  0x20),iVar11) >> 0x18),(char)((uint)iVar11 >> 8)),
                                (ushort)(byte)iVar11) & 0xffffff00ffffff);
    auVar142 = pshuflw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    h->sizeof_hdr =
         CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                  CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                           CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] - (0xff < sVar16),
                                    (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] - (0xff < sVar15))
                          ));
    iVar11 = h->extents;
    auVar143._8_8_ = 0;
    auVar143._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )iVar11 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar11 >> 0x10),iVar11)) >>
                                                  0x20),iVar11) >> 0x18),
                                         CONCAT12((char)((uint)iVar11 >> 8),(short)iVar11)) >> 0x10)
                         ,(short)iVar11) & 0xffff00ff00ff00ff;
    auVar142 = pshuflw(auVar143,auVar143,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    h->extents = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                          CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                   CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                            (0xff < sVar16),
                                            (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                            (0xff < sVar15))));
    psVar1 = &h->session_error;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    lVar141 = 0;
    do {
      psVar1 = h->dim + lVar141;
      *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
      lVar141 = lVar141 + 1;
    } while (lVar141 != 8);
    auVar6._0_4_ = h->intent_p1;
    auVar6._4_4_ = h->intent_p2;
    auVar6._8_4_ = h->intent_p3;
    auVar6._12_2_ = h->intent_code;
    auVar6._14_2_ = h->datatype;
    auVar158[1] = 0;
    auVar158[0] = (byte)auVar6._8_4_;
    auVar158[2] = (char)((uint)auVar6._8_4_ >> 8);
    auVar158[3] = 0;
    auVar158[4] = (char)((uint)auVar6._8_4_ >> 0x10);
    auVar158[5] = 0;
    auVar158[6] = (char)((uint)auVar6._8_4_ >> 0x18);
    auVar158[7] = 0;
    auVar158[8] = (char)auVar6._12_2_;
    auVar158[9] = 0;
    auVar158[10] = (char)((ushort)auVar6._12_2_ >> 8);
    auVar158[0xb] = 0;
    auVar158[0xc] = (char)auVar6._14_2_;
    auVar158[0xd] = 0;
    auVar158[0xe] = (char)((ushort)auVar6._14_2_ >> 8);
    auVar158[0xf] = 0;
    auVar142 = pshuflw(auVar158,auVar158,0x1b);
    auVar159 = pshufhw(auVar142,auVar142,0xb1);
    auVar31[0xd] = 0;
    auVar31._0_13_ = auVar6._0_13_;
    auVar31[0xe] = (char)((uint)auVar6._4_4_ >> 0x18);
    auVar42[0xc] = (char)((uint)auVar6._4_4_ >> 0x10);
    auVar42._0_12_ = auVar6._0_12_;
    auVar42._13_2_ = auVar31._13_2_;
    auVar53[0xb] = 0;
    auVar53._0_11_ = auVar6._0_11_;
    auVar53._12_3_ = auVar42._12_3_;
    auVar64[10] = (char)((uint)auVar6._4_4_ >> 8);
    auVar64._0_10_ = auVar6._0_10_;
    auVar64._11_4_ = auVar53._11_4_;
    auVar75[9] = 0;
    auVar75._0_9_ = auVar6._0_9_;
    auVar75._10_5_ = auVar64._10_5_;
    auVar86[8] = (char)auVar6._4_4_;
    auVar86._0_8_ = auVar6._0_8_;
    auVar86._9_6_ = auVar75._9_6_;
    auVar108._7_8_ = 0;
    auVar108._0_7_ = auVar86._8_7_;
    auVar119._1_8_ = SUB158(auVar108 << 0x40,7);
    auVar119[0] = (char)((uint)auVar6._0_4_ >> 0x18);
    auVar119._9_6_ = 0;
    auVar120._1_10_ = SUB1510(auVar119 << 0x30,5);
    auVar120[0] = (char)((uint)auVar6._0_4_ >> 0x10);
    auVar120._11_4_ = 0;
    auVar97[2] = (char)((uint)auVar6._0_4_ >> 8);
    auVar97._0_2_ = (ushort)auVar6._0_4_;
    auVar97._3_12_ = SUB1512(auVar120 << 0x20,3);
    auVar145._0_2_ = (ushort)auVar6._0_4_ & 0xff;
    auVar145._2_13_ = auVar97._2_13_;
    auVar145[0xf] = 0;
    auVar142 = pshuflw(auVar145,auVar145,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    sVar19 = auVar142._8_2_;
    sVar20 = auVar142._10_2_;
    sVar21 = auVar142._12_2_;
    sVar22 = auVar142._14_2_;
    sVar23 = auVar159._0_2_;
    sVar24 = auVar159._2_2_;
    sVar25 = auVar159._4_2_;
    sVar26 = auVar159._6_2_;
    sVar27 = auVar159._8_2_;
    sVar28 = auVar159._10_2_;
    sVar29 = auVar159._12_2_;
    sVar30 = auVar159._14_2_;
    *(char *)&h->intent_p1 = (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] - (0xff < sVar15);
    *(char *)((long)&h->intent_p1 + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar142[2] - (0xff < sVar16);
    *(char *)((long)&h->intent_p1 + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17);
    *(char *)((long)&h->intent_p1 + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18);
    *(char *)&h->intent_p2 = (0 < sVar19) * (sVar19 < 0x100) * auVar142[8] - (0xff < sVar19);
    *(char *)((long)&h->intent_p2 + 1) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar142[10] - (0xff < sVar20);
    *(char *)((long)&h->intent_p2 + 2) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar142[0xc] - (0xff < sVar21);
    *(char *)((long)&h->intent_p2 + 3) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar142[0xe] - (0xff < sVar22);
    *(char *)&h->intent_p3 = (0 < sVar23) * (sVar23 < 0x100) * auVar159[0] - (0xff < sVar23);
    *(char *)((long)&h->intent_p3 + 1) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar159[2] - (0xff < sVar24);
    *(char *)((long)&h->intent_p3 + 2) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar159[4] - (0xff < sVar25);
    *(char *)((long)&h->intent_p3 + 3) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar159[6] - (0xff < sVar26);
    *(char *)&h->intent_code = (0 < sVar27) * (sVar27 < 0x100) * auVar159[8] - (0xff < sVar27);
    *(char *)((long)&h->intent_code + 1) =
         (0 < sVar28) * (sVar28 < 0x100) * auVar159[10] - (0xff < sVar28);
    *(char *)&h->datatype = (0 < sVar29) * (sVar29 < 0x100) * auVar159[0xc] - (0xff < sVar29);
    *(char *)((long)&h->datatype + 1) =
         (0 < sVar30) * (sVar30 < 0x100) * auVar159[0xe] - (0xff < sVar30);
    uVar12._0_2_ = h->bitpix;
    uVar12._2_2_ = h->slice_start;
    auVar142 = psllw(ZEXT416(uVar12),8);
    uVar13 = auVar142._0_4_ | CONCAT22((ushort)uVar12._2_2_ >> 8,(ushort)(undefined2)uVar12 >> 8);
    h->bitpix = (short)uVar13;
    h->slice_start = (short)(uVar13 >> 0x10);
    lVar141 = 0;
    do {
      fVar14 = h->pixdim[lVar141];
      auVar146._8_8_ = 0;
      auVar146._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                           CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                                 0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
      auVar142 = pshuflw(auVar146,auVar146,0x1b);
      sVar15 = auVar142._0_2_;
      sVar16 = auVar142._2_2_;
      sVar17 = auVar142._4_2_;
      sVar18 = auVar142._6_2_;
      h->pixdim[lVar141] =
           (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                           CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                    CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                             (0xff < sVar16),
                                             (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                             (0xff < sVar15))));
      lVar141 = lVar141 + 1;
    } while (lVar141 != 8);
    uVar2._0_4_ = h->vox_offset;
    uVar2._4_4_ = h->scl_slope;
    auVar32._8_6_ = 0;
    auVar32._0_8_ = uVar2;
    auVar32[0xe] = (char)((uint)uVar2._4_4_ >> 0x18);
    auVar43._8_4_ = 0;
    auVar43._0_8_ = uVar2;
    auVar43[0xc] = (char)((uint)uVar2._4_4_ >> 0x10);
    auVar43._13_2_ = auVar32._13_2_;
    auVar54._8_4_ = 0;
    auVar54._0_8_ = uVar2;
    auVar54._12_3_ = auVar43._12_3_;
    auVar65._8_2_ = 0;
    auVar65._0_8_ = uVar2;
    auVar65[10] = (char)((uint)uVar2._4_4_ >> 8);
    auVar65._11_4_ = auVar54._11_4_;
    auVar76._8_2_ = 0;
    auVar76._0_8_ = uVar2;
    auVar76._10_5_ = auVar65._10_5_;
    auVar87[8] = (char)uVar2._4_4_;
    auVar87._0_8_ = uVar2;
    auVar87._9_6_ = auVar76._9_6_;
    auVar109._7_8_ = 0;
    auVar109._0_7_ = auVar87._8_7_;
    auVar121._1_8_ = SUB158(auVar109 << 0x40,7);
    auVar121[0] = (char)((uint)(undefined4)uVar2 >> 0x18);
    auVar121._9_6_ = 0;
    auVar122._1_10_ = SUB1510(auVar121 << 0x30,5);
    auVar122[0] = (char)((uint)(undefined4)uVar2 >> 0x10);
    auVar122._11_4_ = 0;
    auVar98[2] = (char)((uint)(undefined4)uVar2 >> 8);
    auVar98._0_2_ = (ushort)(undefined4)uVar2;
    auVar98._3_12_ = SUB1512(auVar122 << 0x20,3);
    auVar147._0_2_ = (ushort)(undefined4)uVar2 & 0xff;
    auVar147._2_13_ = auVar98._2_13_;
    auVar147[0xf] = 0;
    auVar142 = pshuflw(auVar147,auVar147,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    uVar144 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                       CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                         (0xff < sVar16),
                                         (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                         (0xff < sVar15))));
    sVar15 = auVar142._8_2_;
    sVar16 = auVar142._10_2_;
    sVar17 = auVar142._12_2_;
    sVar18 = auVar142._14_2_;
    h->vox_offset = (float)uVar144;
    h->scl_slope = (float)(int)(CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar142[0xe] -
                                         (0xff < sVar18),
                                         CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar142[0xc] -
                                                  (0xff < sVar17),
                                                  CONCAT15((0 < sVar16) * (sVar16 < 0x100) *
                                                           auVar142[10] - (0xff < sVar16),
                                                           CONCAT14((0 < sVar15) * (sVar15 < 0x100)
                                                                    * auVar142[8] - (0xff < sVar15),
                                                                    uVar144)))) >> 0x20);
    fVar14 = h->scl_inter;
    auVar148._8_8_ = 0;
    auVar148._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                         CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                               0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
    auVar142 = pshuflw(auVar148,auVar148,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    h->scl_inter = (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                                   CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] -
                                            (0xff < sVar17),
                                            CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                                     (0xff < sVar16),
                                                     (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                                     (0xff < sVar15))));
    psVar1 = &h->slice_end;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    auVar7._0_4_ = h->cal_max;
    auVar7._4_4_ = h->cal_min;
    auVar7._8_4_ = h->slice_duration;
    auVar7._12_4_ = h->toffset;
    auVar8._0_2_ = h->qform_code;
    auVar8._2_2_ = h->sform_code;
    auVar8._4_4_ = h->quatern_b;
    auVar8._8_4_ = h->quatern_c;
    auVar8._12_4_ = h->quatern_d;
    auVar163[1] = 0;
    auVar163[0] = (byte)auVar7._8_4_;
    auVar163[2] = (char)((uint)auVar7._8_4_ >> 8);
    auVar163[3] = 0;
    auVar163[4] = (char)((uint)auVar7._8_4_ >> 0x10);
    auVar163[5] = 0;
    auVar163[6] = (char)((uint)auVar7._8_4_ >> 0x18);
    auVar163[7] = 0;
    auVar163[8] = (char)auVar7._12_4_;
    auVar163[9] = 0;
    auVar163[10] = (char)((uint)auVar7._12_4_ >> 8);
    auVar163[0xb] = 0;
    auVar163[0xc] = (char)((uint)auVar7._12_4_ >> 0x10);
    auVar163[0xd] = 0;
    auVar163[0xe] = (char)((uint)auVar7._12_4_ >> 0x18);
    auVar163[0xf] = 0;
    auVar142 = pshuflw(auVar163,auVar163,0x1b);
    auVar159 = pshufhw(auVar142,auVar142,0x1b);
    auVar33[0xd] = 0;
    auVar33._0_13_ = auVar7._0_13_;
    auVar33[0xe] = (char)((uint)auVar7._4_4_ >> 0x18);
    auVar44[0xc] = (char)((uint)auVar7._4_4_ >> 0x10);
    auVar44._0_12_ = auVar7._0_12_;
    auVar44._13_2_ = auVar33._13_2_;
    auVar55[0xb] = 0;
    auVar55._0_11_ = auVar7._0_11_;
    auVar55._12_3_ = auVar44._12_3_;
    auVar66[10] = (char)((uint)auVar7._4_4_ >> 8);
    auVar66._0_10_ = auVar7._0_10_;
    auVar66._11_4_ = auVar55._11_4_;
    auVar77[9] = 0;
    auVar77._0_9_ = auVar7._0_9_;
    auVar77._10_5_ = auVar66._10_5_;
    auVar88[8] = (char)auVar7._4_4_;
    auVar88._0_8_ = auVar7._0_8_;
    auVar88._9_6_ = auVar77._9_6_;
    auVar110._7_8_ = 0;
    auVar110._0_7_ = auVar88._8_7_;
    auVar123._1_8_ = SUB158(auVar110 << 0x40,7);
    auVar123[0] = (char)((uint)auVar7._0_4_ >> 0x18);
    auVar123._9_6_ = 0;
    auVar124._1_10_ = SUB1510(auVar123 << 0x30,5);
    auVar124[0] = (char)((uint)auVar7._0_4_ >> 0x10);
    auVar124._11_4_ = 0;
    auVar99[2] = (char)((uint)auVar7._0_4_ >> 8);
    auVar99._0_2_ = (ushort)auVar7._0_4_;
    auVar99._3_12_ = SUB1512(auVar124 << 0x20,3);
    auVar149._0_2_ = (ushort)auVar7._0_4_ & 0xff;
    auVar149._2_13_ = auVar99._2_13_;
    auVar149[0xf] = 0;
    auVar142 = pshuflw(auVar149,auVar149,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    sVar19 = auVar142._8_2_;
    sVar20 = auVar142._10_2_;
    sVar21 = auVar142._12_2_;
    sVar22 = auVar142._14_2_;
    sVar23 = auVar159._0_2_;
    sVar24 = auVar159._2_2_;
    sVar25 = auVar159._4_2_;
    sVar26 = auVar159._6_2_;
    sVar27 = auVar159._8_2_;
    sVar28 = auVar159._10_2_;
    sVar29 = auVar159._12_2_;
    sVar30 = auVar159._14_2_;
    *(char *)&h->cal_max = (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] - (0xff < sVar15);
    *(char *)((long)&h->cal_max + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar142[2] - (0xff < sVar16);
    *(char *)((long)&h->cal_max + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17);
    *(char *)((long)&h->cal_max + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18);
    *(char *)&h->cal_min = (0 < sVar19) * (sVar19 < 0x100) * auVar142[8] - (0xff < sVar19);
    *(char *)((long)&h->cal_min + 1) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar142[10] - (0xff < sVar20);
    *(char *)((long)&h->cal_min + 2) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar142[0xc] - (0xff < sVar21);
    *(char *)((long)&h->cal_min + 3) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar142[0xe] - (0xff < sVar22);
    *(char *)&h->slice_duration = (0 < sVar23) * (sVar23 < 0x100) * auVar159[0] - (0xff < sVar23);
    *(char *)((long)&h->slice_duration + 1) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar159[2] - (0xff < sVar24);
    *(char *)((long)&h->slice_duration + 2) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar159[4] - (0xff < sVar25);
    *(char *)((long)&h->slice_duration + 3) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar159[6] - (0xff < sVar26);
    *(char *)&h->toffset = (0 < sVar27) * (sVar27 < 0x100) * auVar159[8] - (0xff < sVar27);
    *(char *)((long)&h->toffset + 1) =
         (0 < sVar28) * (sVar28 < 0x100) * auVar159[10] - (0xff < sVar28);
    *(char *)((long)&h->toffset + 2) =
         (0 < sVar29) * (sVar29 < 0x100) * auVar159[0xc] - (0xff < sVar29);
    *(char *)((long)&h->toffset + 3) =
         (0 < sVar30) * (sVar30 < 0x100) * auVar159[0xe] - (0xff < sVar30);
    uVar3._0_4_ = h->glmax;
    uVar3._4_4_ = h->glmin;
    auVar34._8_6_ = 0;
    auVar34._0_8_ = uVar3;
    auVar34[0xe] = (char)((uint)uVar3._4_4_ >> 0x18);
    auVar45._8_4_ = 0;
    auVar45._0_8_ = uVar3;
    auVar45[0xc] = (char)((uint)uVar3._4_4_ >> 0x10);
    auVar45._13_2_ = auVar34._13_2_;
    auVar56._8_4_ = 0;
    auVar56._0_8_ = uVar3;
    auVar56._12_3_ = auVar45._12_3_;
    auVar67._8_2_ = 0;
    auVar67._0_8_ = uVar3;
    auVar67[10] = (char)((uint)uVar3._4_4_ >> 8);
    auVar67._11_4_ = auVar56._11_4_;
    auVar78._8_2_ = 0;
    auVar78._0_8_ = uVar3;
    auVar78._10_5_ = auVar67._10_5_;
    auVar89[8] = (char)uVar3._4_4_;
    auVar89._0_8_ = uVar3;
    auVar89._9_6_ = auVar78._9_6_;
    auVar111._7_8_ = 0;
    auVar111._0_7_ = auVar89._8_7_;
    auVar125._1_8_ = SUB158(auVar111 << 0x40,7);
    auVar125[0] = (char)((uint)(undefined4)uVar3 >> 0x18);
    auVar125._9_6_ = 0;
    auVar126._1_10_ = SUB1510(auVar125 << 0x30,5);
    auVar126[0] = (char)((uint)(undefined4)uVar3 >> 0x10);
    auVar126._11_4_ = 0;
    auVar100[2] = (char)((uint)(undefined4)uVar3 >> 8);
    auVar100._0_2_ = (ushort)(undefined4)uVar3;
    auVar100._3_12_ = SUB1512(auVar126 << 0x20,3);
    auVar150._0_2_ = (ushort)(undefined4)uVar3 & 0xff;
    auVar150._2_13_ = auVar100._2_13_;
    auVar150[0xf] = 0;
    auVar142 = pshuflw(auVar150,auVar150,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    uVar144 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                       CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                         (0xff < sVar16),
                                         (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                         (0xff < sVar15))));
    sVar15 = auVar142._8_2_;
    sVar16 = auVar142._10_2_;
    sVar17 = auVar142._12_2_;
    sVar18 = auVar142._14_2_;
    h->glmax = uVar144;
    h->glmin = (int)(CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar142[0xe] - (0xff < sVar18),
                              CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar142[0xc] -
                                       (0xff < sVar17),
                                       CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar142[10] -
                                                (0xff < sVar16),
                                                CONCAT14((0 < sVar15) * (sVar15 < 0x100) *
                                                         auVar142[8] - (0xff < sVar15),uVar144))))
                    >> 0x20);
    auVar151[1] = 0;
    auVar151[0] = (byte)auVar8._8_4_;
    auVar151[2] = (char)((uint)auVar8._8_4_ >> 8);
    auVar151[3] = 0;
    auVar151[4] = (char)((uint)auVar8._8_4_ >> 0x10);
    auVar151[5] = 0;
    auVar151[6] = (char)((uint)auVar8._8_4_ >> 0x18);
    auVar151[7] = 0;
    auVar151[8] = (char)auVar8._12_4_;
    auVar151[9] = 0;
    auVar151[10] = (char)((uint)auVar8._12_4_ >> 8);
    auVar151[0xb] = 0;
    auVar151[0xc] = (char)((uint)auVar8._12_4_ >> 0x10);
    auVar151[0xd] = 0;
    auVar151[0xe] = (char)((uint)auVar8._12_4_ >> 0x18);
    auVar151[0xf] = 0;
    auVar142 = pshuflw(auVar151,auVar151,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    auVar35[0xd] = 0;
    auVar35._0_13_ = auVar8._0_13_;
    auVar35[0xe] = (char)((uint)auVar8._4_4_ >> 0x18);
    auVar46[0xc] = (char)((uint)auVar8._4_4_ >> 0x10);
    auVar46._0_12_ = auVar8._0_12_;
    auVar46._13_2_ = auVar35._13_2_;
    auVar57[0xb] = 0;
    auVar57._0_11_ = auVar8._0_11_;
    auVar57._12_3_ = auVar46._12_3_;
    auVar68[10] = (char)((uint)auVar8._4_4_ >> 8);
    auVar68._0_10_ = auVar8._0_10_;
    auVar68._11_4_ = auVar57._11_4_;
    auVar79[9] = 0;
    auVar79._0_9_ = auVar8._0_9_;
    auVar79._10_5_ = auVar68._10_5_;
    auVar90[8] = (char)auVar8._4_4_;
    auVar90._0_8_ = auVar8._0_8_;
    auVar90._9_6_ = auVar79._9_6_;
    auVar112._7_8_ = 0;
    auVar112._0_7_ = auVar90._8_7_;
    auVar127._1_8_ = SUB158(auVar112 << 0x40,7);
    auVar127[0] = (char)((ushort)auVar8._2_2_ >> 8);
    auVar127._9_6_ = 0;
    auVar128._1_10_ = SUB1510(auVar127 << 0x30,5);
    auVar128[0] = (char)auVar8._2_2_;
    auVar128._11_4_ = 0;
    auVar101[2] = (char)((ushort)auVar8._0_2_ >> 8);
    auVar101._0_2_ = auVar8._0_2_;
    auVar101._3_12_ = SUB1512(auVar128 << 0x20,3);
    auVar160._0_2_ = auVar8._0_2_ & 0xff;
    auVar160._2_13_ = auVar101._2_13_;
    auVar160[0xf] = 0;
    auVar159 = pshuflw(auVar160,auVar160,0xb1);
    auVar159 = pshufhw(auVar159,auVar159,0x1b);
    sVar15 = auVar159._0_2_;
    sVar16 = auVar159._2_2_;
    sVar17 = auVar159._4_2_;
    sVar18 = auVar159._6_2_;
    sVar19 = auVar159._8_2_;
    sVar20 = auVar159._10_2_;
    sVar21 = auVar159._12_2_;
    sVar22 = auVar159._14_2_;
    sVar23 = auVar142._0_2_;
    sVar24 = auVar142._2_2_;
    sVar25 = auVar142._4_2_;
    sVar26 = auVar142._6_2_;
    sVar27 = auVar142._8_2_;
    sVar28 = auVar142._10_2_;
    sVar29 = auVar142._12_2_;
    sVar30 = auVar142._14_2_;
    *(char *)&h->qform_code = (0 < sVar15) * (sVar15 < 0x100) * auVar159[0] - (0xff < sVar15);
    *(char *)((long)&h->qform_code + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar159[2] - (0xff < sVar16);
    *(char *)&h->sform_code = (0 < sVar17) * (sVar17 < 0x100) * auVar159[4] - (0xff < sVar17);
    *(char *)((long)&h->sform_code + 1) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar159[6] - (0xff < sVar18);
    *(char *)&h->quatern_b = (0 < sVar19) * (sVar19 < 0x100) * auVar159[8] - (0xff < sVar19);
    *(char *)((long)&h->quatern_b + 1) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar159[10] - (0xff < sVar20);
    *(char *)((long)&h->quatern_b + 2) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar159[0xc] - (0xff < sVar21);
    *(char *)((long)&h->quatern_b + 3) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar159[0xe] - (0xff < sVar22);
    *(char *)&h->quatern_c = (0 < sVar23) * (sVar23 < 0x100) * auVar142[0] - (0xff < sVar23);
    *(char *)((long)&h->quatern_c + 1) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar142[2] - (0xff < sVar24);
    *(char *)((long)&h->quatern_c + 2) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar142[4] - (0xff < sVar25);
    *(char *)((long)&h->quatern_c + 3) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar142[6] - (0xff < sVar26);
    *(char *)&h->quatern_d = (0 < sVar27) * (sVar27 < 0x100) * auVar142[8] - (0xff < sVar27);
    *(char *)((long)&h->quatern_d + 1) =
         (0 < sVar28) * (sVar28 < 0x100) * auVar142[10] - (0xff < sVar28);
    *(char *)((long)&h->quatern_d + 2) =
         (0 < sVar29) * (sVar29 < 0x100) * auVar142[0xc] - (0xff < sVar29);
    *(char *)((long)&h->quatern_d + 3) =
         (0 < sVar30) * (sVar30 < 0x100) * auVar142[0xe] - (0xff < sVar30);
    uVar4._0_4_ = h->qoffset_x;
    uVar4._4_4_ = h->qoffset_y;
    auVar36._8_6_ = 0;
    auVar36._0_8_ = uVar4;
    auVar36[0xe] = (char)((uint)uVar4._4_4_ >> 0x18);
    auVar47._8_4_ = 0;
    auVar47._0_8_ = uVar4;
    auVar47[0xc] = (char)((uint)uVar4._4_4_ >> 0x10);
    auVar47._13_2_ = auVar36._13_2_;
    auVar58._8_4_ = 0;
    auVar58._0_8_ = uVar4;
    auVar58._12_3_ = auVar47._12_3_;
    auVar69._8_2_ = 0;
    auVar69._0_8_ = uVar4;
    auVar69[10] = (char)((uint)uVar4._4_4_ >> 8);
    auVar69._11_4_ = auVar58._11_4_;
    auVar80._8_2_ = 0;
    auVar80._0_8_ = uVar4;
    auVar80._10_5_ = auVar69._10_5_;
    auVar91[8] = (char)uVar4._4_4_;
    auVar91._0_8_ = uVar4;
    auVar91._9_6_ = auVar80._9_6_;
    auVar113._7_8_ = 0;
    auVar113._0_7_ = auVar91._8_7_;
    auVar129._1_8_ = SUB158(auVar113 << 0x40,7);
    auVar129[0] = (char)((uint)(undefined4)uVar4 >> 0x18);
    auVar129._9_6_ = 0;
    auVar130._1_10_ = SUB1510(auVar129 << 0x30,5);
    auVar130[0] = (char)((uint)(undefined4)uVar4 >> 0x10);
    auVar130._11_4_ = 0;
    auVar102[2] = (char)((uint)(undefined4)uVar4 >> 8);
    auVar102._0_2_ = (ushort)(undefined4)uVar4;
    auVar102._3_12_ = SUB1512(auVar130 << 0x20,3);
    auVar152._0_2_ = (ushort)(undefined4)uVar4 & 0xff;
    auVar152._2_13_ = auVar102._2_13_;
    auVar152[0xf] = 0;
    auVar142 = pshuflw(auVar152,auVar152,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    uVar144 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                       CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                         (0xff < sVar16),
                                         (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                         (0xff < sVar15))));
    sVar15 = auVar142._8_2_;
    sVar16 = auVar142._10_2_;
    sVar17 = auVar142._12_2_;
    sVar18 = auVar142._14_2_;
    h->qoffset_x = (float)uVar144;
    h->qoffset_y = (float)(int)(CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar142[0xe] -
                                         (0xff < sVar18),
                                         CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar142[0xc] -
                                                  (0xff < sVar17),
                                                  CONCAT15((0 < sVar16) * (sVar16 < 0x100) *
                                                           auVar142[10] - (0xff < sVar16),
                                                           CONCAT14((0 < sVar15) * (sVar15 < 0x100)
                                                                    * auVar142[8] - (0xff < sVar15),
                                                                    uVar144)))) >> 0x20);
    fVar14 = h->qoffset_z;
    auVar153._8_8_ = 0;
    auVar153._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                         CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                               0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
    auVar142 = pshuflw(auVar153,auVar153,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    h->qoffset_z = (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                                   CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] -
                                            (0xff < sVar17),
                                            CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                                     (0xff < sVar16),
                                                     (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                                     (0xff < sVar15))));
    lVar141 = 0;
    do {
      fVar14 = h->srow_x[lVar141];
      auVar154._8_8_ = 0;
      auVar154._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                           CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                                 0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
      auVar142 = pshuflw(auVar154,auVar154,0x1b);
      sVar15 = auVar142._0_2_;
      sVar16 = auVar142._2_2_;
      sVar17 = auVar142._4_2_;
      sVar18 = auVar142._6_2_;
      h->srow_x[lVar141] =
           (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                           CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                    CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                             (0xff < sVar16),
                                             (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                             (0xff < sVar15))));
      lVar141 = lVar141 + 1;
    } while (lVar141 != 4);
    lVar141 = 0;
    do {
      fVar14 = h->srow_y[lVar141];
      auVar155._8_8_ = 0;
      auVar155._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                           CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                                 0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
      auVar142 = pshuflw(auVar155,auVar155,0x1b);
      sVar15 = auVar142._0_2_;
      sVar16 = auVar142._2_2_;
      sVar17 = auVar142._4_2_;
      sVar18 = auVar142._6_2_;
      h->srow_y[lVar141] =
           (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                           CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                    CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                             (0xff < sVar16),
                                             (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                             (0xff < sVar15))));
      lVar141 = lVar141 + 1;
    } while (lVar141 != 4);
    lVar141 = 0;
    do {
      fVar14 = h->srow_z[lVar141];
      auVar156._8_8_ = 0;
      auVar156._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                           CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                                 0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
      auVar142 = pshuflw(auVar156,auVar156,0x1b);
      sVar15 = auVar142._0_2_;
      sVar16 = auVar142._2_2_;
      sVar17 = auVar142._4_2_;
      sVar18 = auVar142._6_2_;
      h->srow_z[lVar141] =
           (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                           CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                    CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                             (0xff < sVar16),
                                             (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                             (0xff < sVar15))));
      lVar141 = lVar141 + 1;
    } while (lVar141 != 4);
    return;
  }
  if (h != (nifti_1_header *)0x0) {
    iVar11 = h->sizeof_hdr;
    auVar142 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )iVar11 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar11 >> 0x10),iVar11)) >>
                                                  0x20),iVar11) >> 0x18),(char)((uint)iVar11 >> 8)),
                                (ushort)(byte)iVar11) & 0xffffff00ffffff);
    auVar142 = pshuflw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    h->sizeof_hdr =
         CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                  CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                           CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] - (0xff < sVar16),
                                    (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] - (0xff < sVar15))
                          ));
    iVar11 = h->extents;
    auVar142._8_8_ = 0;
    auVar142._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )iVar11 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar11 >> 0x10),iVar11)) >>
                                                  0x20),iVar11) >> 0x18),
                                         CONCAT12((char)((uint)iVar11 >> 8),(short)iVar11)) >> 0x10)
                         ,(short)iVar11) & 0xffff00ff00ff00ff;
    auVar142 = pshuflw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    h->extents = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                          CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                   CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                            (0xff < sVar16),
                                            (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                            (0xff < sVar15))));
    psVar1 = &h->session_error;
    *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
    lVar141 = 0;
    do {
      psVar1 = h->dim + lVar141;
      *psVar1 = *psVar1 << 8 | (ushort)*psVar1 >> 8;
      lVar141 = lVar141 + 1;
    } while (lVar141 != 8);
    auVar159._0_4_ = h->intent_p1;
    auVar159._4_4_ = h->intent_p2;
    auVar159._8_4_ = h->intent_p3;
    auVar159._12_2_ = h->intent_code;
    auVar159._14_2_ = h->datatype;
    auVar170._0_2_ = (ushort)auVar159._0_4_ >> 8;
    auVar170._2_2_ = (ushort)((uint)auVar159._0_4_ >> 0x18);
    auVar170._4_2_ = (ushort)auVar159._4_4_ >> 8;
    auVar170._6_2_ = (ushort)((uint)auVar159._4_4_ >> 0x18);
    auVar170._8_2_ = (ushort)auVar159._8_4_ >> 8;
    auVar170._10_2_ = (ushort)((uint)auVar159._8_4_ >> 0x18);
    auVar170._12_2_ = (ushort)auVar159._12_2_ >> 8;
    auVar170._14_2_ = (ushort)auVar159._14_2_ >> 8;
    auVar142 = psllw(auVar159,8);
    auVar142 = auVar142 | auVar170;
    h->intent_p1 = (float)auVar142._0_4_;
    h->intent_p2 = (float)auVar142._4_4_;
    h->intent_p3 = (float)auVar142._8_4_;
    h->intent_code = auVar142._12_2_;
    h->datatype = auVar142._14_2_;
    uVar13._0_2_ = h->bitpix;
    uVar13._2_2_ = h->slice_start;
    auVar142 = psllw(ZEXT416(uVar13),8);
    uVar13 = auVar142._0_4_ | CONCAT22((ushort)uVar13._2_2_ >> 8,(ushort)(undefined2)uVar13 >> 8);
    h->bitpix = (short)uVar13;
    h->slice_start = (short)(uVar13 >> 0x10);
    lVar141 = 0;
    do {
      fVar14 = h->pixdim[lVar141];
      auVar171._8_8_ = 0;
      auVar171._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar14 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar14 >> 0x10),fVar14)) >>
                                                  0x20),fVar14) >> 0x18),
                                           CONCAT12((char)((uint)fVar14 >> 8),SUB42(fVar14,0))) >>
                                 0x10),SUB42(fVar14,0)) & 0xffff00ff00ff00ff;
      auVar142 = pshuflw(auVar171,auVar171,0x1b);
      sVar15 = auVar142._0_2_;
      sVar16 = auVar142._2_2_;
      sVar17 = auVar142._4_2_;
      sVar18 = auVar142._6_2_;
      h->pixdim[lVar141] =
           (float)CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18),
                           CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17),
                                    CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar142[2] -
                                             (0xff < sVar16),
                                             (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] -
                                             (0xff < sVar15))));
      lVar141 = lVar141 + 1;
    } while (lVar141 != 8);
    auVar9._0_4_ = h->vox_offset;
    auVar9._4_4_ = h->scl_slope;
    auVar9._8_4_ = h->scl_inter;
    auVar9._12_2_ = h->slice_end;
    auVar9[0xe] = h->slice_code;
    auVar9[0xf] = h->xyzt_units;
    auVar10._0_4_ = h->cal_max;
    auVar10._4_4_ = h->cal_min;
    auVar10._8_4_ = h->slice_duration;
    auVar10._12_4_ = h->toffset;
    auVar142 = *(undefined1 (*) [16])(h->srow_z + 1);
    auVar159 = *(undefined1 (*) [16])(h->intent_name + 4);
    auVar169[1] = 0;
    auVar169[0] = (byte)auVar9._8_4_;
    auVar169[2] = (char)((uint)auVar9._8_4_ >> 8);
    auVar169[3] = 0;
    auVar169[4] = (char)((uint)auVar9._8_4_ >> 0x10);
    auVar169[5] = 0;
    auVar169[6] = (char)((uint)auVar9._8_4_ >> 0x18);
    auVar169[7] = 0;
    auVar169[8] = (char)auVar9._12_2_;
    auVar169[9] = 0;
    auVar169[10] = (char)((ushort)auVar9._12_2_ >> 8);
    auVar169[0xb] = 0;
    auVar169[0xc] = auVar9[0xe];
    auVar169[0xd] = 0;
    auVar169[0xe] = auVar9[0xf];
    auVar169[0xf] = 0;
    auVar170 = pshuflw(auVar169,auVar169,0x1b);
    auVar171 = pshufhw(auVar170,auVar170,0x1b);
    auVar37[0xd] = 0;
    auVar37._0_13_ = auVar9._0_13_;
    auVar37[0xe] = (char)((uint)auVar9._4_4_ >> 0x18);
    auVar48[0xc] = (char)((uint)auVar9._4_4_ >> 0x10);
    auVar48._0_12_ = auVar9._0_12_;
    auVar48._13_2_ = auVar37._13_2_;
    auVar59[0xb] = 0;
    auVar59._0_11_ = auVar9._0_11_;
    auVar59._12_3_ = auVar48._12_3_;
    auVar70[10] = (char)((uint)auVar9._4_4_ >> 8);
    auVar70._0_10_ = auVar9._0_10_;
    auVar70._11_4_ = auVar59._11_4_;
    auVar81[9] = 0;
    auVar81._0_9_ = auVar9._0_9_;
    auVar81._10_5_ = auVar70._10_5_;
    auVar92[8] = (char)auVar9._4_4_;
    auVar92._0_8_ = auVar9._0_8_;
    auVar92._9_6_ = auVar81._9_6_;
    auVar114._7_8_ = 0;
    auVar114._0_7_ = auVar92._8_7_;
    auVar131._1_8_ = SUB158(auVar114 << 0x40,7);
    auVar131[0] = (char)((uint)auVar9._0_4_ >> 0x18);
    auVar131._9_6_ = 0;
    auVar132._1_10_ = SUB1510(auVar131 << 0x30,5);
    auVar132[0] = (char)((uint)auVar9._0_4_ >> 0x10);
    auVar132._11_4_ = 0;
    auVar103[2] = (char)((uint)auVar9._0_4_ >> 8);
    auVar103._0_2_ = (ushort)auVar9._0_4_;
    auVar103._3_12_ = SUB1512(auVar132 << 0x20,3);
    auVar164._0_2_ = (ushort)auVar9._0_4_ & 0xff;
    auVar164._2_13_ = auVar103._2_13_;
    auVar164[0xf] = 0;
    auVar170 = pshuflw(auVar164,auVar164,0x1b);
    auVar170 = pshufhw(auVar170,auVar170,0x1b);
    sVar15 = auVar170._0_2_;
    sVar16 = auVar170._2_2_;
    sVar17 = auVar170._4_2_;
    sVar18 = auVar170._6_2_;
    sVar19 = auVar170._8_2_;
    sVar20 = auVar170._10_2_;
    sVar21 = auVar170._12_2_;
    sVar22 = auVar170._14_2_;
    sVar23 = auVar171._0_2_;
    sVar24 = auVar171._2_2_;
    sVar25 = auVar171._4_2_;
    sVar26 = auVar171._6_2_;
    sVar27 = auVar171._8_2_;
    sVar28 = auVar171._10_2_;
    sVar29 = auVar171._12_2_;
    sVar30 = auVar171._14_2_;
    *(char *)&h->vox_offset = (0 < sVar15) * (sVar15 < 0x100) * auVar170[0] - (0xff < sVar15);
    *(char *)((long)&h->vox_offset + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar170[2] - (0xff < sVar16);
    *(char *)((long)&h->vox_offset + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar170[4] - (0xff < sVar17);
    *(char *)((long)&h->vox_offset + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar170[6] - (0xff < sVar18);
    *(char *)&h->scl_slope = (0 < sVar19) * (sVar19 < 0x100) * auVar170[8] - (0xff < sVar19);
    *(char *)((long)&h->scl_slope + 1) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar170[10] - (0xff < sVar20);
    *(char *)((long)&h->scl_slope + 2) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar170[0xc] - (0xff < sVar21);
    *(char *)((long)&h->scl_slope + 3) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar170[0xe] - (0xff < sVar22);
    *(char *)&h->scl_inter = (0 < sVar23) * (sVar23 < 0x100) * auVar171[0] - (0xff < sVar23);
    *(char *)((long)&h->scl_inter + 1) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar171[2] - (0xff < sVar24);
    *(char *)((long)&h->scl_inter + 2) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar171[4] - (0xff < sVar25);
    *(char *)((long)&h->scl_inter + 3) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar171[6] - (0xff < sVar26);
    *(char *)&h->slice_end = (0 < sVar27) * (sVar27 < 0x100) * auVar171[8] - (0xff < sVar27);
    *(char *)((long)&h->slice_end + 1) =
         (0 < sVar28) * (sVar28 < 0x100) * auVar171[10] - (0xff < sVar28);
    h->slice_code = (0 < sVar29) * (sVar29 < 0x100) * auVar171[0xc] - (0xff < sVar29);
    h->xyzt_units = (0 < sVar30) * (sVar30 < 0x100) * auVar171[0xe] - (0xff < sVar30);
    auVar165[1] = 0;
    auVar165[0] = (byte)auVar10._8_4_;
    auVar165[2] = (char)((uint)auVar10._8_4_ >> 8);
    auVar165[3] = 0;
    auVar165[4] = (char)((uint)auVar10._8_4_ >> 0x10);
    auVar165[5] = 0;
    auVar165[6] = (char)((uint)auVar10._8_4_ >> 0x18);
    auVar165[7] = 0;
    auVar165[8] = (char)auVar10._12_4_;
    auVar165[9] = 0;
    auVar165[10] = (char)((uint)auVar10._12_4_ >> 8);
    auVar165[0xb] = 0;
    auVar165[0xc] = (char)((uint)auVar10._12_4_ >> 0x10);
    auVar165[0xd] = 0;
    auVar165[0xe] = (char)((uint)auVar10._12_4_ >> 0x18);
    auVar165[0xf] = 0;
    auVar170 = pshuflw(auVar165,auVar165,0x1b);
    auVar170 = pshufhw(auVar170,auVar170,0x1b);
    auVar38[0xd] = 0;
    auVar38._0_13_ = auVar10._0_13_;
    auVar38[0xe] = (char)((uint)auVar10._4_4_ >> 0x18);
    auVar49[0xc] = (char)((uint)auVar10._4_4_ >> 0x10);
    auVar49._0_12_ = auVar10._0_12_;
    auVar49._13_2_ = auVar38._13_2_;
    auVar60[0xb] = 0;
    auVar60._0_11_ = auVar10._0_11_;
    auVar60._12_3_ = auVar49._12_3_;
    auVar71[10] = (char)((uint)auVar10._4_4_ >> 8);
    auVar71._0_10_ = auVar10._0_10_;
    auVar71._11_4_ = auVar60._11_4_;
    auVar82[9] = 0;
    auVar82._0_9_ = auVar10._0_9_;
    auVar82._10_5_ = auVar71._10_5_;
    auVar93[8] = (char)auVar10._4_4_;
    auVar93._0_8_ = auVar10._0_8_;
    auVar93._9_6_ = auVar82._9_6_;
    auVar115._7_8_ = 0;
    auVar115._0_7_ = auVar93._8_7_;
    auVar133._1_8_ = SUB158(auVar115 << 0x40,7);
    auVar133[0] = (char)((uint)auVar10._0_4_ >> 0x18);
    auVar133._9_6_ = 0;
    auVar134._1_10_ = SUB1510(auVar133 << 0x30,5);
    auVar134[0] = (char)((uint)auVar10._0_4_ >> 0x10);
    auVar134._11_4_ = 0;
    auVar104[2] = (char)((uint)auVar10._0_4_ >> 8);
    auVar104._0_2_ = (ushort)auVar10._0_4_;
    auVar104._3_12_ = SUB1512(auVar134 << 0x20,3);
    auVar168._0_2_ = (ushort)auVar10._0_4_ & 0xff;
    auVar168._2_13_ = auVar104._2_13_;
    auVar168[0xf] = 0;
    auVar171 = pshuflw(auVar168,auVar168,0x1b);
    auVar171 = pshufhw(auVar171,auVar171,0x1b);
    sVar15 = auVar171._0_2_;
    sVar16 = auVar171._2_2_;
    sVar17 = auVar171._4_2_;
    sVar18 = auVar171._6_2_;
    sVar19 = auVar171._8_2_;
    sVar20 = auVar171._10_2_;
    sVar21 = auVar171._12_2_;
    sVar22 = auVar171._14_2_;
    sVar23 = auVar170._0_2_;
    sVar24 = auVar170._2_2_;
    sVar25 = auVar170._4_2_;
    sVar26 = auVar170._6_2_;
    sVar27 = auVar170._8_2_;
    sVar28 = auVar170._10_2_;
    sVar29 = auVar170._12_2_;
    sVar30 = auVar170._14_2_;
    *(char *)&h->cal_max = (0 < sVar15) * (sVar15 < 0x100) * auVar171[0] - (0xff < sVar15);
    *(char *)((long)&h->cal_max + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar171[2] - (0xff < sVar16);
    *(char *)((long)&h->cal_max + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar171[4] - (0xff < sVar17);
    *(char *)((long)&h->cal_max + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar171[6] - (0xff < sVar18);
    *(char *)&h->cal_min = (0 < sVar19) * (sVar19 < 0x100) * auVar171[8] - (0xff < sVar19);
    *(char *)((long)&h->cal_min + 1) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar171[10] - (0xff < sVar20);
    *(char *)((long)&h->cal_min + 2) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar171[0xc] - (0xff < sVar21);
    *(char *)((long)&h->cal_min + 3) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar171[0xe] - (0xff < sVar22);
    *(char *)&h->slice_duration = (0 < sVar23) * (sVar23 < 0x100) * auVar170[0] - (0xff < sVar23);
    *(char *)((long)&h->slice_duration + 1) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar170[2] - (0xff < sVar24);
    *(char *)((long)&h->slice_duration + 2) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar170[4] - (0xff < sVar25);
    *(char *)((long)&h->slice_duration + 3) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar170[6] - (0xff < sVar26);
    *(char *)&h->toffset = (0 < sVar27) * (sVar27 < 0x100) * auVar170[8] - (0xff < sVar27);
    *(char *)((long)&h->toffset + 1) =
         (0 < sVar28) * (sVar28 < 0x100) * auVar170[10] - (0xff < sVar28);
    *(char *)((long)&h->toffset + 2) =
         (0 < sVar29) * (sVar29 < 0x100) * auVar170[0xc] - (0xff < sVar29);
    *(char *)((long)&h->toffset + 3) =
         (0 < sVar30) * (sVar30 < 0x100) * auVar170[0xe] - (0xff < sVar30);
    uVar5._0_4_ = h->glmax;
    uVar5._4_4_ = h->glmin;
    auVar39._8_6_ = 0;
    auVar39._0_8_ = uVar5;
    auVar39[0xe] = (char)((uint)uVar5._4_4_ >> 0x18);
    auVar50._8_4_ = 0;
    auVar50._0_8_ = uVar5;
    auVar50[0xc] = (char)((uint)uVar5._4_4_ >> 0x10);
    auVar50._13_2_ = auVar39._13_2_;
    auVar61._8_4_ = 0;
    auVar61._0_8_ = uVar5;
    auVar61._12_3_ = auVar50._12_3_;
    auVar72._8_2_ = 0;
    auVar72._0_8_ = uVar5;
    auVar72[10] = (char)((uint)uVar5._4_4_ >> 8);
    auVar72._11_4_ = auVar61._11_4_;
    auVar83._8_2_ = 0;
    auVar83._0_8_ = uVar5;
    auVar83._10_5_ = auVar72._10_5_;
    auVar94[8] = (char)uVar5._4_4_;
    auVar94._0_8_ = uVar5;
    auVar94._9_6_ = auVar83._9_6_;
    auVar116._7_8_ = 0;
    auVar116._0_7_ = auVar94._8_7_;
    auVar135._1_8_ = SUB158(auVar116 << 0x40,7);
    auVar135[0] = (char)((uint)(undefined4)uVar5 >> 0x18);
    auVar135._9_6_ = 0;
    auVar136._1_10_ = SUB1510(auVar135 << 0x30,5);
    auVar136[0] = (char)((uint)(undefined4)uVar5 >> 0x10);
    auVar136._11_4_ = 0;
    auVar105[2] = (char)((uint)(undefined4)uVar5 >> 8);
    auVar105._0_2_ = (ushort)(undefined4)uVar5;
    auVar105._3_12_ = SUB1512(auVar136 << 0x20,3);
    auVar166._0_2_ = (ushort)(undefined4)uVar5 & 0xff;
    auVar166._2_13_ = auVar105._2_13_;
    auVar166[0xf] = 0;
    auVar170 = pshuflw(auVar166,auVar166,0x1b);
    auVar170 = pshufhw(auVar170,auVar170,0x1b);
    sVar15 = auVar170._0_2_;
    sVar16 = auVar170._2_2_;
    sVar17 = auVar170._4_2_;
    sVar18 = auVar170._6_2_;
    uVar144 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar170[6] - (0xff < sVar18),
                       CONCAT12((0 < sVar17) * (sVar17 < 0x100) * auVar170[4] - (0xff < sVar17),
                                CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar170[2] -
                                         (0xff < sVar16),
                                         (0 < sVar15) * (sVar15 < 0x100) * auVar170[0] -
                                         (0xff < sVar15))));
    sVar15 = auVar170._8_2_;
    sVar16 = auVar170._10_2_;
    sVar17 = auVar170._12_2_;
    sVar18 = auVar170._14_2_;
    h->glmax = uVar144;
    h->glmin = (int)(CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar170[0xe] - (0xff < sVar18),
                              CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar170[0xc] -
                                       (0xff < sVar17),
                                       CONCAT15((0 < sVar16) * (sVar16 < 0x100) * auVar170[10] -
                                                (0xff < sVar16),
                                                CONCAT14((0 < sVar15) * (sVar15 < 0x100) *
                                                         auVar170[8] - (0xff < sVar15),uVar144))))
                    >> 0x20);
    auVar167[1] = 0;
    auVar167[0] = auVar142[8];
    auVar167[2] = auVar142[9];
    auVar167[3] = 0;
    auVar167[4] = auVar142[10];
    auVar167[5] = 0;
    auVar167[6] = auVar142[0xb];
    auVar167[7] = 0;
    auVar167[8] = auVar142[0xc];
    auVar167[9] = 0;
    auVar167[10] = auVar142[0xd];
    auVar167[0xb] = 0;
    auVar167[0xc] = auVar142[0xe];
    auVar167[0xd] = 0;
    auVar167[0xe] = auVar142[0xf];
    auVar167[0xf] = 0;
    auVar170 = pshuflw(auVar167,auVar167,0x1b);
    auVar170 = pshufhw(auVar170,auVar170,0x1b);
    auVar40[0xd] = 0;
    auVar40._0_13_ = auVar142._0_13_;
    auVar40[0xe] = auVar142[7];
    auVar51[0xc] = auVar142[6];
    auVar51._0_12_ = auVar142._0_12_;
    auVar51._13_2_ = auVar40._13_2_;
    auVar62[0xb] = 0;
    auVar62._0_11_ = auVar142._0_11_;
    auVar62._12_3_ = auVar51._12_3_;
    auVar73[10] = auVar142[5];
    auVar73._0_10_ = auVar142._0_10_;
    auVar73._11_4_ = auVar62._11_4_;
    auVar84[9] = 0;
    auVar84._0_9_ = auVar142._0_9_;
    auVar84._10_5_ = auVar73._10_5_;
    auVar95[8] = auVar142[4];
    auVar95._0_8_ = auVar142._0_8_;
    auVar95._9_6_ = auVar84._9_6_;
    auVar117._7_8_ = 0;
    auVar117._0_7_ = auVar95._8_7_;
    auVar137._1_8_ = SUB158(auVar117 << 0x40,7);
    auVar137[0] = auVar142[3];
    auVar137._9_6_ = 0;
    auVar138._1_10_ = SUB1510(auVar137 << 0x30,5);
    auVar138[0] = auVar142[2];
    auVar138._11_4_ = 0;
    auVar106[2] = auVar142[1];
    auVar106._0_2_ = auVar142._0_2_;
    auVar106._3_12_ = SUB1512(auVar138 << 0x20,3);
    auVar161._0_2_ = auVar142._0_2_ & 0xff;
    auVar161._2_13_ = auVar106._2_13_;
    auVar161[0xf] = 0;
    auVar142 = pshuflw(auVar161,auVar161,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    sVar19 = auVar142._8_2_;
    sVar20 = auVar142._10_2_;
    sVar21 = auVar142._12_2_;
    sVar22 = auVar142._14_2_;
    sVar23 = auVar170._0_2_;
    sVar24 = auVar170._2_2_;
    sVar25 = auVar170._4_2_;
    sVar26 = auVar170._6_2_;
    sVar27 = auVar170._8_2_;
    sVar28 = auVar170._10_2_;
    sVar29 = auVar170._12_2_;
    sVar30 = auVar170._14_2_;
    *(char *)(h->srow_z + 1) = (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] - (0xff < sVar15);
    *(char *)((long)h->srow_z + 5) = (0 < sVar16) * (sVar16 < 0x100) * auVar142[2] - (0xff < sVar16)
    ;
    *(char *)((long)h->srow_z + 6) = (0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17)
    ;
    *(char *)((long)h->srow_z + 7) = (0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18)
    ;
    *(char *)(h->srow_z + 2) = (0 < sVar19) * (sVar19 < 0x100) * auVar142[8] - (0xff < sVar19);
    *(char *)((long)h->srow_z + 9) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar142[10] - (0xff < sVar20);
    *(char *)((long)h->srow_z + 10) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar142[0xc] - (0xff < sVar21);
    *(char *)((long)h->srow_z + 0xb) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar142[0xe] - (0xff < sVar22);
    *(char *)(h->srow_z + 3) = (0 < sVar23) * (sVar23 < 0x100) * auVar170[0] - (0xff < sVar23);
    *(char *)((long)h->srow_z + 0xd) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar170[2] - (0xff < sVar24);
    *(char *)((long)h->srow_z + 0xe) =
         (0 < sVar25) * (sVar25 < 0x100) * auVar170[4] - (0xff < sVar25);
    *(char *)((long)h->srow_z + 0xf) =
         (0 < sVar26) * (sVar26 < 0x100) * auVar170[6] - (0xff < sVar26);
    h->intent_name[0] = (0 < sVar27) * (sVar27 < 0x100) * auVar170[8] - (0xff < sVar27);
    h->intent_name[1] = (0 < sVar28) * (sVar28 < 0x100) * auVar170[10] - (0xff < sVar28);
    h->intent_name[2] = (0 < sVar29) * (sVar29 < 0x100) * auVar170[0xc] - (0xff < sVar29);
    h->intent_name[3] = (0 < sVar30) * (sVar30 < 0x100) * auVar170[0xe] - (0xff < sVar30);
    auVar162[1] = 0;
    auVar162[0] = auVar159[8];
    auVar162[2] = auVar159[9];
    auVar162[3] = 0;
    auVar162[4] = auVar159[10];
    auVar162[5] = 0;
    auVar162[6] = auVar159[0xb];
    auVar162[7] = 0;
    auVar162[8] = auVar159[0xc];
    auVar162[9] = 0;
    auVar162[10] = auVar159[0xd];
    auVar162[0xb] = 0;
    auVar162[0xc] = auVar159[0xe];
    auVar162[0xd] = 0;
    auVar162[0xe] = auVar159[0xf];
    auVar162[0xf] = 0;
    auVar142 = pshuflw(auVar162,auVar162,0x1b);
    auVar170 = pshufhw(auVar142,auVar142,0x1b);
    auVar41[0xd] = 0;
    auVar41._0_13_ = auVar159._0_13_;
    auVar41[0xe] = auVar159[7];
    auVar52[0xc] = auVar159[6];
    auVar52._0_12_ = auVar159._0_12_;
    auVar52._13_2_ = auVar41._13_2_;
    auVar63[0xb] = 0;
    auVar63._0_11_ = auVar159._0_11_;
    auVar63._12_3_ = auVar52._12_3_;
    auVar74[10] = auVar159[5];
    auVar74._0_10_ = auVar159._0_10_;
    auVar74._11_4_ = auVar63._11_4_;
    auVar85[9] = 0;
    auVar85._0_9_ = auVar159._0_9_;
    auVar85._10_5_ = auVar74._10_5_;
    auVar96[8] = auVar159[4];
    auVar96._0_8_ = auVar159._0_8_;
    auVar96._9_6_ = auVar85._9_6_;
    auVar118._7_8_ = 0;
    auVar118._0_7_ = auVar96._8_7_;
    auVar139._1_8_ = SUB158(auVar118 << 0x40,7);
    auVar139[0] = auVar159[3];
    auVar139._9_6_ = 0;
    auVar140._1_10_ = SUB1510(auVar139 << 0x30,5);
    auVar140[0] = auVar159[2];
    auVar140._11_4_ = 0;
    auVar107[2] = auVar159[1];
    auVar107._0_2_ = auVar159._0_2_;
    auVar107._3_12_ = SUB1512(auVar140 << 0x20,3);
    auVar157._0_2_ = auVar159._0_2_ & 0xff;
    auVar157._2_13_ = auVar107._2_13_;
    auVar157[0xf] = 0;
    auVar142 = pshuflw((undefined1  [16])0x0,auVar157,0x1b);
    auVar142 = pshufhw(auVar142,auVar142,0x1b);
    sVar15 = auVar142._0_2_;
    sVar16 = auVar142._2_2_;
    sVar17 = auVar142._4_2_;
    sVar18 = auVar142._6_2_;
    sVar19 = auVar142._8_2_;
    sVar20 = auVar142._10_2_;
    sVar21 = auVar142._12_2_;
    sVar22 = auVar142._14_2_;
    sVar23 = auVar170._0_2_;
    sVar24 = auVar170._2_2_;
    sVar25 = auVar170._4_2_;
    sVar26 = auVar170._6_2_;
    sVar27 = auVar170._8_2_;
    sVar28 = auVar170._10_2_;
    sVar29 = auVar170._12_2_;
    sVar30 = auVar170._14_2_;
    h->intent_name[4] = (0 < sVar15) * (sVar15 < 0x100) * auVar142[0] - (0xff < sVar15);
    h->intent_name[5] = (0 < sVar16) * (sVar16 < 0x100) * auVar142[2] - (0xff < sVar16);
    h->intent_name[6] = (0 < sVar17) * (sVar17 < 0x100) * auVar142[4] - (0xff < sVar17);
    h->intent_name[7] = (0 < sVar18) * (sVar18 < 0x100) * auVar142[6] - (0xff < sVar18);
    h->intent_name[8] = (0 < sVar19) * (sVar19 < 0x100) * auVar142[8] - (0xff < sVar19);
    h->intent_name[9] = (0 < sVar20) * (sVar20 < 0x100) * auVar142[10] - (0xff < sVar20);
    h->intent_name[10] = (0 < sVar21) * (sVar21 < 0x100) * auVar142[0xc] - (0xff < sVar21);
    h->intent_name[0xb] = (0 < sVar22) * (sVar22 < 0x100) * auVar142[0xe] - (0xff < sVar22);
    h->intent_name[0xc] = (0 < sVar23) * (sVar23 < 0x100) * auVar170[0] - (0xff < sVar23);
    h->intent_name[0xd] = (0 < sVar24) * (sVar24 < 0x100) * auVar170[2] - (0xff < sVar24);
    h->intent_name[0xe] = (0 < sVar25) * (sVar25 < 0x100) * auVar170[4] - (0xff < sVar25);
    h->intent_name[0xf] = (0 < sVar26) * (sVar26 < 0x100) * auVar170[6] - (0xff < sVar26);
    h->magic[0] = (0 < sVar27) * (sVar27 < 0x100) * auVar170[8] - (0xff < sVar27);
    h->magic[1] = (0 < sVar28) * (sVar28 < 0x100) * auVar170[10] - (0xff < sVar28);
    h->magic[2] = (0 < sVar29) * (sVar29 < 0x100) * auVar170[0xc] - (0xff < sVar29);
    h->magic[3] = (0 < sVar30) * (sVar30 < 0x100) * auVar170[0xe] - (0xff < sVar30);
    return;
  }
  return;
}

Assistant:

void swap_nifti_header( struct nifti_1_header *h , int is_nifti )
{

   /* if ANALYZE, swap as such and return */
   if( ! is_nifti ) {
      nifti_swap_as_analyze((nifti_analyze75 *)h);
      return;
   }

   /* otherwise, swap all NIFTI fields */

   nifti_swap_4bytes(1, &h->sizeof_hdr);
   nifti_swap_4bytes(1, &h->extents);
   nifti_swap_2bytes(1, &h->session_error);

   nifti_swap_2bytes(8, h->dim);
   nifti_swap_4bytes(1, &h->intent_p1);
   nifti_swap_4bytes(1, &h->intent_p2);
   nifti_swap_4bytes(1, &h->intent_p3);

   nifti_swap_2bytes(1, &h->intent_code);
   nifti_swap_2bytes(1, &h->datatype);
   nifti_swap_2bytes(1, &h->bitpix);
   nifti_swap_2bytes(1, &h->slice_start);

   nifti_swap_4bytes(8, h->pixdim);

   nifti_swap_4bytes(1, &h->vox_offset);
   nifti_swap_4bytes(1, &h->scl_slope);
   nifti_swap_4bytes(1, &h->scl_inter);
   nifti_swap_2bytes(1, &h->slice_end);

   nifti_swap_4bytes(1, &h->cal_max);
   nifti_swap_4bytes(1, &h->cal_min);
   nifti_swap_4bytes(1, &h->slice_duration);
   nifti_swap_4bytes(1, &h->toffset);
   nifti_swap_4bytes(1, &h->glmax);
   nifti_swap_4bytes(1, &h->glmin);

   nifti_swap_2bytes(1, &h->qform_code);
   nifti_swap_2bytes(1, &h->sform_code);

   nifti_swap_4bytes(1, &h->quatern_b);
   nifti_swap_4bytes(1, &h->quatern_c);
   nifti_swap_4bytes(1, &h->quatern_d);
   nifti_swap_4bytes(1, &h->qoffset_x);
   nifti_swap_4bytes(1, &h->qoffset_y);
   nifti_swap_4bytes(1, &h->qoffset_z);

   nifti_swap_4bytes(4, h->srow_x);
   nifti_swap_4bytes(4, h->srow_y);
   nifti_swap_4bytes(4, h->srow_z);

   return ;
}